

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.cpp
# Opt level: O1

void llvm::yaml::MappingTraits<llvm::DWARFYAML::LineTableOpcode>::mapping
               (IO *IO,LineTableOpcode *LineTableOpcode)

{
  int iVar1;
  EmptyContext local_20;
  EmptyContext local_1f;
  EmptyContext local_1e;
  EmptyContext local_1d;
  EmptyContext local_1c;
  EmptyContext local_1b;
  EmptyContext local_1a;
  EmptyContext local_19;
  EmptyContext Ctx_7;
  EmptyContext Ctx_6;
  EmptyContext Ctx_5;
  EmptyContext Ctx_4;
  EmptyContext Ctx_3;
  EmptyContext Ctx_2;
  EmptyContext Ctx_1;
  EmptyContext Ctx;
  
  yaml::IO::processKey<llvm::dwarf::LineNumberOps,llvm::yaml::EmptyContext>
            (IO,"Opcode",&LineTableOpcode->Opcode,true,&local_19);
  if (LineTableOpcode->Opcode == DW_LNS_extended_op) {
    yaml::IO::processKey<unsigned_long,llvm::yaml::EmptyContext>
              (IO,"ExtLen",&LineTableOpcode->ExtLen,true,&local_1a);
    yaml::IO::processKey<llvm::dwarf::LineNumberExtendedOps,llvm::yaml::EmptyContext>
              (IO,"SubOpcode",&LineTableOpcode->SubOpcode,true,&local_1b);
  }
  if ((LineTableOpcode->UnknownOpcodeData).
      super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (LineTableOpcode->UnknownOpcodeData).
      super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar1 = (*IO->_vptr_IO[2])(IO);
    if ((char)iVar1 == '\0') goto LAB_00da38cd;
  }
  else {
LAB_00da38cd:
    yaml::IO::
    mapOptionalWithContext<std::vector<llvm::yaml::Hex8,std::allocator<llvm::yaml::Hex8>>,llvm::yaml::EmptyContext>
              (IO,"UnknownOpcodeData",&LineTableOpcode->UnknownOpcodeData,&local_1c);
  }
  if ((LineTableOpcode->UnknownOpcodeData).
      super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (LineTableOpcode->UnknownOpcodeData).
      super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar1 = (*IO->_vptr_IO[2])(IO);
    if ((char)iVar1 == '\0') goto LAB_00da38fb;
  }
  else {
LAB_00da38fb:
    yaml::IO::
    mapOptionalWithContext<std::vector<llvm::yaml::Hex64,std::allocator<llvm::yaml::Hex64>>,llvm::yaml::EmptyContext>
              (IO,"StandardOpcodeData",&LineTableOpcode->StandardOpcodeData,&local_1d);
  }
  if ((LineTableOpcode->FileEntry).Name.Length == 0) {
    iVar1 = (*IO->_vptr_IO[2])(IO);
    if ((char)iVar1 == '\0') goto LAB_00da3926;
  }
  else {
LAB_00da3926:
    yaml::IO::processKey<llvm::DWARFYAML::File,llvm::yaml::EmptyContext>
              (IO,"FileEntry",&LineTableOpcode->FileEntry,false,&local_1e);
  }
  if (LineTableOpcode->Opcode != DW_LNS_advance_line) {
    iVar1 = (*IO->_vptr_IO[2])(IO);
    if ((char)iVar1 != '\0') goto LAB_00da396a;
  }
  yaml::IO::processKey<long,llvm::yaml::EmptyContext>
            (IO,"SData",&LineTableOpcode->SData,false,&local_1f);
LAB_00da396a:
  yaml::IO::processKey<unsigned_long,llvm::yaml::EmptyContext>
            (IO,"Data",&LineTableOpcode->Data,false,&local_20);
  return;
}

Assistant:

void MappingTraits<DWARFYAML::LineTableOpcode>::mapping(
    IO &IO, DWARFYAML::LineTableOpcode &LineTableOpcode) {
  IO.mapRequired("Opcode", LineTableOpcode.Opcode);
  if (LineTableOpcode.Opcode == dwarf::DW_LNS_extended_op) {
    IO.mapRequired("ExtLen", LineTableOpcode.ExtLen);
    IO.mapRequired("SubOpcode", LineTableOpcode.SubOpcode);
  }

  if (!LineTableOpcode.UnknownOpcodeData.empty() || !IO.outputting())
    IO.mapOptional("UnknownOpcodeData", LineTableOpcode.UnknownOpcodeData);
  if (!LineTableOpcode.UnknownOpcodeData.empty() || !IO.outputting())
    IO.mapOptional("StandardOpcodeData", LineTableOpcode.StandardOpcodeData);
  if (!LineTableOpcode.FileEntry.Name.empty() || !IO.outputting())
    IO.mapOptional("FileEntry", LineTableOpcode.FileEntry);
  if (LineTableOpcode.Opcode == dwarf::DW_LNS_advance_line || !IO.outputting())
    IO.mapOptional("SData", LineTableOpcode.SData);
  IO.mapOptional("Data", LineTableOpcode.Data);
}